

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.h
# Opt level: O1

void __thiscall Assimp::XGLImporter::TempScope::dismiss(TempScope *this)

{
  pointer ppaVar1;
  pointer ppaVar2;
  
  this->light = (aiLight *)0x0;
  ppaVar1 = (this->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar1) {
    (this->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar1;
  }
  ppaVar2 = (this->materials_linear).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->materials_linear).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppaVar2) {
    (this->materials_linear).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppaVar2;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMesh_*>,_std::_Select1st<std::pair<const_unsigned_int,_aiMesh_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMesh_*>,_std::_Select1st<std::pair<const_unsigned_int,_aiMesh_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
           *)this);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMaterial_*>,_std::_Select1st<std::pair<const_unsigned_int,_aiMaterial_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
  ::clear(&(this->materials)._M_t);
  return;
}

Assistant:

void dismiss() {
            light = NULL;
            meshes_linear.clear();
            materials_linear.clear();
            meshes.clear();
            materials.clear();
        }